

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server_http.hpp
# Opt level: O2

ssize_t __thiscall
SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Response::
write(Response *this,int __fd,void *__buf,size_t __n)

{
  undefined8 in_RAX;
  ostream *poVar1;
  string *psVar2;
  ssize_t extraout_RAX;
  
  poVar1 = std::operator<<(&this->super_ostream,"HTTP/1.1 ");
  psVar2 = status_code_abi_cxx11_((StatusCode)((ulong)in_RAX >> 0x20));
  poVar1 = std::operator<<(poVar1,(string *)psVar2);
  std::operator<<(poVar1,"\r\n");
  write_header<int>(this,(CaseInsensitiveMultimap *)__buf,0);
  return extraout_RAX;
}

Assistant:

void write(StatusCode status_code = StatusCode::success_ok, const CaseInsensitiveMultimap &header = CaseInsensitiveMultimap()) {
        *this << "HTTP/1.1 " << SimpleWeb::status_code(status_code) << "\r\n";
        write_header(header, 0);
      }